

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

ProcessOpenModeResult *
processOpenModeFlags(ProcessOpenModeResult *__return_storage_ptr__,OpenMode openMode)

{
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar1;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar2;
  qsizetype qVar3;
  char *pcVar4;
  QLatin1StringView other;
  
  (__return_storage_ptr__->error).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->error).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->error).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->error).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->error).d.size = 0;
  *(undefined8 *)&__return_storage_ptr__->openMode = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->error).d.d + 4) = 0;
  __return_storage_ptr__->ok = false;
  if ((~(uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
              super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0xc0) == 0) {
    pcVar4 = "NewOnly and ExistingOnly are mutually exclusive";
    qVar3 = 0x2f;
  }
  else {
    if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x83) != 0x80) {
      QVar1.i = (uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i | 2;
      if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                 super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x44) == 0) {
        QVar1.i = (Int)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
      }
      QVar2.i = QVar1.i | 8;
      if ((QVar1.i & 0x45) != 0) {
        QVar2.i = QVar1.i;
      }
      if ((QVar1.i & 2) == 0) {
        QVar2.i = QVar1.i;
      }
      __return_storage_ptr__->ok = true;
      (__return_storage_ptr__->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = QVar2.i;
      return __return_storage_ptr__;
    }
    pcVar4 = "ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite";
    qVar3 = 0x4a;
  }
  other.m_size = qVar3;
  other.m_data = pcVar4;
  QString::operator=(&__return_storage_ptr__->error,other);
  return __return_storage_ptr__;
}

Assistant:

ProcessOpenModeResult processOpenModeFlags(QIODevice::OpenMode openMode)
{
    ProcessOpenModeResult result;
    result.ok = false;
    if ((openMode & QFile::NewOnly) && (openMode & QFile::ExistingOnly)) {
        qWarning("NewOnly and ExistingOnly are mutually exclusive");
        result.error = "NewOnly and ExistingOnly are mutually exclusive"_L1;
        return result;
    }

    if ((openMode & QFile::ExistingOnly) && !(openMode & (QFile::ReadOnly | QFile::WriteOnly))) {
        qWarning("ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite");
        result.error =
                    "ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite"_L1;
        return result;
    }

    // Either Append or NewOnly implies WriteOnly
    if (openMode & (QFile::Append | QFile::NewOnly))
        openMode |= QFile::WriteOnly;

    // WriteOnly implies Truncate when ReadOnly, Append, and NewOnly are not set.
    if ((openMode & QFile::WriteOnly) && !(openMode & (QFile::ReadOnly | QFile::Append | QFile::NewOnly)))
        openMode |= QFile::Truncate;

    result.ok = true;
    result.openMode = openMode;
    return result;
}